

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

size_t ggml_nbytes(ggml_tensor *tensor)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (0 < tensor->ne[0]) {
    lVar3 = 3;
    do {
      lVar5 = lVar3;
      if (lVar5 == 6) goto LAB_001194b4;
      lVar3 = lVar5 + 1;
    } while (0 < tensor->ne[lVar5 + -2]);
    if (2 < lVar5 - 3U) {
LAB_001194b4:
      uVar2 = (ulong)tensor->type;
      if ((0x5f000003UL >> (uVar2 & 0x3f) & 1) == 0) {
        lVar3 = 0;
        uVar2 = (tensor->nb[0] * tensor->ne[0]) / (ulong)type_traits[uVar2].blck_size;
        do {
          uVar2 = uVar2 + (tensor->ne[lVar3 + 1] + -1) * tensor->nb[lVar3 + 1];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        return uVar2;
      }
      sVar4 = type_traits[uVar2].type_size;
      lVar5 = 0;
      lVar3 = -4;
      do {
        uVar6 = tensor->nb[lVar3] - 1;
        uVar7 = (tensor->nb + lVar3)[1] - 1;
        uVar2 = tensor->nb[lVar3 + 4];
        uVar1 = (tensor->nb + lVar3 + 4)[1];
        sVar4 = sVar4 + (uVar6 & 0xffffffff) * (uVar2 & 0xffffffff) +
                ((uVar6 >> 0x20) * (uVar2 & 0xffffffff) + (uVar2 >> 0x20) * (uVar6 & 0xffffffff) <<
                0x20);
        lVar5 = lVar5 + (uVar7 & 0xffffffff) * (uVar1 & 0xffffffff) +
                ((uVar7 >> 0x20) * (uVar1 & 0xffffffff) + (uVar1 >> 0x20) * (uVar7 & 0xffffffff) <<
                0x20);
        lVar3 = lVar3 + 2;
      } while (lVar3 != 0);
      return lVar5 + sVar4;
    }
  }
  return 0;
}

Assistant:

size_t ggml_nbytes(const struct ggml_tensor * tensor) {
    for (int i = 0; i < GGML_MAX_DIMS; ++i) {
        if (tensor->ne[i] <= 0) {
            return 0;
        }
    }

    size_t nbytes;
    const size_t blck_size = ggml_blck_size(tensor->type);
    if (blck_size == 1) {
        nbytes = ggml_type_size(tensor->type);
        for (int i = 0; i < GGML_MAX_DIMS; ++i) {
            nbytes += (tensor->ne[i] - 1)*tensor->nb[i];
        }
    }
    else {
        nbytes = tensor->ne[0]*tensor->nb[0]/blck_size;
        for (int i = 1; i < GGML_MAX_DIMS; ++i) {
            nbytes += (tensor->ne[i] - 1)*tensor->nb[i];
        }
    }

    return nbytes;
}